

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (void)

{
  node_ptr plVar1;
  bool bVar2;
  char *local_808;
  char *local_800;
  Index local_7f8 [2];
  undefined8 local_7f0;
  shared_count sStack_7e8;
  undefined **local_7e0;
  undefined1 local_7d8;
  undefined8 *local_7d0;
  char **local_7c8;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  value_type boundary1;
  value_type boundary2;
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_> m
  ;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary2,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(orderedBoundaries.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary1,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(orderedBoundaries.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)&m,&orderedBoundaries,5);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  bVar2 = Gudhi::persistence_matrix::
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
          ::is_non_zero(m.matrix_.matrix_.
                        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_entry(1, 0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_7c8 = &local_808;
  local_7f8[0]._0_1_ = !bVar2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  local_7f8[0]._0_1_ =
       Gudhi::persistence_matrix::
       Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
       ::is_non_zero(m.matrix_.matrix_.
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3,0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_entry(3, 0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  plVar1 = ((m.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &(m.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(1)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(2)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 != (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_ && plVar1 != (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(3)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0] = CONCAT31(local_7f8[0]._1_3_,
                          plVar1 != (node_ptr)
                                    &m.matrix_.matrix_.
                                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4].column_ &&
                          plVar1 != (node_ptr)0x0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(4)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_7f8[0] = m.matrix_.nextInsertIndex_;
  local_808._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_1b0,0x1c2,1,2,local_7f8,"m.get_number_of_columns()",&local_808,"5");
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)&m,&boundary1,-1);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x1c4);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_7f8[0] = m.matrix_.nextInsertIndex_;
  local_808._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_1e0,0x1c4,1,2,local_7f8,"m.get_number_of_columns()",&local_808,"6");
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)&m,&boundary2,-1);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c6);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_7f8[0] = m.matrix_.nextInsertIndex_;
  local_808 = (char *)CONCAT44(local_808._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_210,0x1c6,1,2,local_7f8,"m.get_number_of_columns()",&local_808,"7");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c7);
  bVar2 = Gudhi::persistence_matrix::
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
          ::is_non_zero(m.matrix_.matrix_.
                        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_entry(1, 0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_7c8 = &local_808;
  local_7f8[0]._0_1_ = !bVar2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c8);
  local_7f8[0]._0_1_ =
       Gudhi::persistence_matrix::
       Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
       ::is_non_zero(m.matrix_.matrix_.
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3,0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_entry(3, 0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1c9);
  plVar1 = ((m.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &(m.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(0)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1ca);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(1)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1cb);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 == (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].column_ || plVar1 == (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "m.is_zero_column(2)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1cc);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 != (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_ && plVar1 != (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(3)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1cd);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 != (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[4].column_ && plVar1 != (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(4)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1d1);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0]._0_1_ =
       plVar1 != (node_ptr)
                 &m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].column_ && plVar1 != (node_ptr)0x0;
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(5)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1d3);
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0] = CONCAT31(local_7f8[0]._1_3_,
                          plVar1 != (node_ptr)
                                    &m.matrix_.matrix_.
                                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[6].column_ &&
                          plVar1 != (node_ptr)0x0);
  local_7f0 = 0;
  sStack_7e8.pi_ = (sp_counted_base *)0x0;
  local_808 = "!m.is_zero_column(6)";
  local_800 = "";
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d4238;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_7c8 = &local_808;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7e8);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x1d5);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e8 = "";
  local_7f8[0] = ((m.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_808 = (char *)((ulong)local_808 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_3f0,0x1d5,1,2,local_7f8,"m.get_column_dimension(0)",&local_808,"0");
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1d6);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_808 = (char *)((ulong)local_808 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_420,0x1d6,1,2,local_7f8,"m.get_column_dimension(1)",&local_808,"0");
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x1d7);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_808 = (char *)((ulong)local_808 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_450,0x1d7,1,2,local_7f8,"m.get_column_dimension(2)",&local_808,"0");
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1d8);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_808._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_480,0x1d8,1,2,local_7f8,"m.get_column_dimension(3)",&local_808,"1");
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x1d9);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_808._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_4b0,0x1d9,1,2,local_7f8,"m.get_column_dimension(4)",&local_808,"1");
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1da);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_808._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_4e0,0x1da,1,2,local_7f8,"m.get_column_dimension(5)",&local_808,"1");
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x1db);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_508 = "";
  local_7f8[0] = m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_808._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7e0,&local_510,0x1db,1,2,local_7f8,"m.get_column_dimension(6)",&local_808,"2");
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1dd);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_740 = "";
  plVar1 = ((m.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_7f8[0] = 0xffffffff;
  if (plVar1 != (node_ptr)
                &(m.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->column_ && plVar1 != (node_ptr)0x0) {
    local_7f8[0] = *(Index *)&((m.matrix_.matrix_.
                                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.
                              data_.root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_7e0,&local_748,0x1dd,1,2,local_7f8,"m.get_pivot(0)",&local_808,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x1de);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_7e0,&local_758,0x1de,1,2,local_7f8,"m.get_pivot(1)",&local_808,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_560,0x1df);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_760 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_7e0,&local_768,0x1df,1,2,local_7f8,"m.get_pivot(2)",&local_808,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x1e0);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_770 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_778,0x1e0,1,2,local_7f8,"m.get_pivot(3)",&local_808,"1");
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5a0,0x1e1);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_780 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_788,0x1e1,1,2,local_7f8,"m.get_pivot(4)",&local_808,"2");
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5c0,0x1e5);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_790 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_798,0x1e5,1,2,local_7f8,"m.get_pivot(5)",&local_808,"2");
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5d8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5e0,0x1e7);
  local_7d8 = 0;
  local_7e0 = &PTR__lazy_ostream_001d40f8;
  local_7d0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = (char **)0x182454;
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7a0 = "";
  plVar1 = m.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  if (plVar1 == (node_ptr)
                &m.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6].column_ || plVar1 == (node_ptr)0x0) {
    local_7f8[0] = 0xffffffff;
  }
  else {
    local_7f8[0] = *(Index *)&m.matrix_.matrix_.
                              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.
                              root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_808 = (char *)CONCAT44(local_808._4_4_,5);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_7e0,&local_7a8,0x1e7,1,2,local_7f8,"m.get_pivot(6)",&local_808,"5");
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  ~Matrix(&m);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&boundary1.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&boundary2.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}